

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_paged_audio_buffer__data_source_on_get_length
                    (ma_data_source *pDataSource,ma_uint64 *pLength)

{
  ma_result mVar1;
  
  mVar1 = ma_paged_audio_buffer_data_get_length_in_pcm_frames
                    (*(ma_paged_audio_buffer_data **)((long)pDataSource + 0x48),pLength);
  return mVar1;
}

Assistant:

static ma_result ma_paged_audio_buffer__data_source_on_get_length(ma_data_source* pDataSource, ma_uint64* pLength)
{
    return ma_paged_audio_buffer_get_length_in_pcm_frames((ma_paged_audio_buffer*)pDataSource, pLength);
}